

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_if_udp.c
# Opt level: O0

void csp_if_udp_init(csp_iface_t *iface,csp_if_udp_conf_t *ifconf)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  undefined8 *in_RSI;
  void *in_RDI;
  int ret;
  pthread_attr_t attributes;
  undefined4 in_stack_ffffffffffffffb0;
  pthread_attr_t local_48;
  undefined8 *local_10;
  void *local_8;
  
  *(undefined8 **)((long)in_RDI + 0x18) = in_RSI;
  local_10 = in_RSI;
  local_8 = in_RDI;
  iVar1 = inet_aton((char *)*in_RSI,(in_addr *)((long)in_RSI + 0x1c));
  if (iVar1 == 0) {
    csp_print_func("  Unknown peer address %s\n",*local_10);
  }
  pcVar3 = inet_ntoa((in_addr)*(in_addr_t *)((long)local_10 + 0x1c));
  csp_print_func("  UDP peer address: %s:%d (listening on port %d)\n",pcVar3,
                 (ulong)*(uint *)((long)local_10 + 0xc),(ulong)*(uint *)(local_10 + 1));
  uVar2 = pthread_attr_init(&local_48);
  if (uVar2 != 0) {
    pcVar3 = strerror(uVar2);
    csp_print_func("csp_if_udp_init: pthread_attr_init failed: %s: %d\n",pcVar3,(ulong)uVar2);
  }
  uVar2 = pthread_attr_setdetachstate(&local_48,1);
  if (uVar2 != 0) {
    pcVar3 = strerror(uVar2);
    csp_print_func("csp_if_udp_init: pthread_attr_setdetachstate failed: %s: %d\n",pcVar3,
                   (ulong)uVar2);
  }
  uVar2 = pthread_create(local_10 + 2,&local_48,csp_if_udp_rx_loop,local_8);
  if (uVar2 != 0) {
    pcVar3 = strerror(uVar2);
    csp_print_func("csp_if_udp_init: pthread_create failed: %s: %d\n",pcVar3,(ulong)uVar2);
  }
  uVar2 = pthread_attr_destroy(&local_48);
  if (uVar2 != 0) {
    pcVar3 = strerror(uVar2);
    csp_print_func("csp_if_udp_init: pthread_attr_destroy failed: %s: %d\n",pcVar3,(ulong)uVar2);
  }
  *(char **)((long)local_8 + 8) = "UDP";
  *(code **)((long)local_8 + 0x20) = csp_if_udp_tx;
  csp_iflist_add((csp_iface_t *)CONCAT44(uVar2,in_stack_ffffffffffffffb0));
  return;
}

Assistant:

void csp_if_udp_init(csp_iface_t * iface, csp_if_udp_conf_t * ifconf) {

	pthread_attr_t attributes;
	int ret;

	iface->driver_data = ifconf;

	if (inet_aton(ifconf->host, &ifconf->peer_addr.sin_addr) == 0) {
		csp_print("  Unknown peer address %s\n", ifconf->host);
	}

	csp_print("  UDP peer address: %s:%d (listening on port %d)\n", inet_ntoa(ifconf->peer_addr.sin_addr), ifconf->rport, ifconf->lport);

	/* Start server thread */
	ret = pthread_attr_init(&attributes);
	if (ret != 0) {
		csp_print("csp_if_udp_init: pthread_attr_init failed: %s: %d\n", strerror(ret), ret);
	}
	ret = pthread_attr_setdetachstate(&attributes, PTHREAD_CREATE_DETACHED);
	if (ret != 0) {
		csp_print("csp_if_udp_init: pthread_attr_setdetachstate failed: %s: %d\n", strerror(ret), ret);
	}
	ret = pthread_create(&ifconf->server_handle, &attributes, csp_if_udp_rx_loop, iface);
	if (ret != 0) {
		csp_print("csp_if_udp_init: pthread_create failed: %s: %d\n", strerror(ret), ret);
	}
	ret = pthread_attr_destroy(&attributes);
	if (ret != 0) {
		csp_print("csp_if_udp_init: pthread_attr_destroy failed: %s: %d\n", strerror(ret), ret);
	}

	/* Register interface */
	iface->name = "UDP",
	iface->nexthop = csp_if_udp_tx,
	csp_iflist_add(iface);
}